

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O0

ValidSchema avro::compileJsonSchemaFromStream(InputStream *is)

{
  shared_count extraout_RDX;
  element_type *in_RDI;
  ValidSchema VVar1;
  InputStream *in_stack_00000018;
  NodePtr n;
  SymbolTable st;
  Entity e;
  allocator<char> *this;
  allocator<char> local_81;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  
  json::loadEntity(in_stack_00000018);
  std::
  map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
  ::map((map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
         *)0x1a20f3);
  this = &local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  makeNode((Entity *)e._0_8_,(SymbolTable *)st._M_t._M_impl.super__Rb_tree_header._M_node_count,
           (string *)st._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  std::allocator<char>::~allocator(&local_81);
  ValidSchema::ValidSchema((ValidSchema *)this,(NodePtr *)in_RDI);
  boost::shared_ptr<avro::Node>::~shared_ptr((shared_ptr<avro::Node> *)0x1a2167);
  std::
  map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
  ::~map((map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
          *)0x1a2171);
  json::Entity::~Entity((Entity *)0x1a217e);
  VVar1.root_.pn.pi_ = extraout_RDX.pi_;
  VVar1.root_.px = in_RDI;
  return (ValidSchema)VVar1.root_;
}

Assistant:

AVRO_DECL ValidSchema compileJsonSchemaFromStream(InputStream& is)
{
    json::Entity e = json::loadEntity(is);
    SymbolTable st;
    NodePtr n = makeNode(e, st, "");
    return ValidSchema(n);
}